

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::PromiseNode::OnReadyEvent::armBreadthFirst(OnReadyEvent *this)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  Event **local_40;
  undefined1 local_38 [8];
  DebugComparison<kj::_::Event_*&,_kj::_::Event_*> _kjCondition;
  OnReadyEvent *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (Event **)
             DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->event)
  ;
  f.exception = (Exception *)0x1;
  DebugExpression<kj::_::Event*&>::operator!=
            ((DebugComparison<kj::_::Event_*&,_kj::_::Event_*> *)local_38,
             (DebugExpression<kj::_::Event*&> *)&local_40,(Event **)&f);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::Event*&,kj::_::Event*>&,char_const(&)[45]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x95e,FAILED,"event != _kJ_ALREADY_READY",
               "_kjCondition,\"armBreadthFirst() should only be called once\"",
               (DebugComparison<kj::_::Event_*&,_kj::_::Event_*> *)local_38,
               (char (*) [45])"armBreadthFirst() should only be called once");
    Debug::Fault::fatal(&local_50);
  }
  if (this->event != (Event *)0x0) {
    Event::armBreadthFirst(this->event);
  }
  this->event = (Event *)0x1;
  return;
}

Assistant:

void PromiseNode::OnReadyEvent::armBreadthFirst() {
  KJ_ASSERT(event != _kJ_ALREADY_READY, "armBreadthFirst() should only be called once");

  if (event != nullptr) {
    // A promise resolved and an event is already waiting on it.
    event->armBreadthFirst();
  }

  event = _kJ_ALREADY_READY;
}